

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  byte *ptr;
  int *piVar3;
  char *pcVar4;
  char *__format;
  stat st;
  stat sStack_a8;
  
  if (argc == 2) {
    iVar1 = stat(argv[1],&sStack_a8);
    if (iVar1 == -1) {
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      __format = "stat failed with: %s\n";
    }
    else {
      iVar1 = open(argv[1],0);
      if (iVar1 == -1) {
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        __format = "open failed with: %s\n";
      }
      else {
        printf("file size: %zd\n",sStack_a8.st_size);
        ptr = (byte *)mmap((void *)0x0,sStack_a8.st_size,1,2,iVar1,0);
        if (ptr == (byte *)0xffffffffffffffff) {
          piVar3 = __errno_location();
          pcVar4 = strerror(*piVar3);
          __format = "mmap failed with: %s\n";
        }
        else {
          extract(ptr,sStack_a8.st_size);
          iVar2 = munmap(ptr,sStack_a8.st_size);
          if (iVar2 == 0) {
            close(iVar1);
            return 0;
          }
          piVar3 = __errno_location();
          pcVar4 = strerror(*piVar3);
          __format = "munmap failed with: %s\n";
        }
      }
    }
    printf(__format,pcVar4);
  }
  else {
    puts("usage: llvmbc-dump <ifile>");
  }
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    int fd, err;
    struct stat st;
    byte *data;
    int64_t sz;

    if (argc != 2) {
        printf("usage: llvmbc-dump <ifile>\n");
        return 0;
    }

    err = stat(argv[1], &st);
    if (err == -1) {
        printf("stat failed with: %s\n", strerror(errno));
        return 0;
    }

    fd = open(argv[1], O_RDONLY);
    if (fd == -1) {
        printf("open failed with: %s\n", strerror(errno));
        return 0;
    }

    sz = st.st_size;
    printf("file size: %zd\n", st.st_size);

    data = (byte *) mmap(NULL, st.st_size, PROT_READ, MAP_PRIVATE, fd, 0);
    if (data == MAP_FAILED) {
        printf("mmap failed with: %s\n", strerror(errno));
        return 0;
    }

    if (0) {
        dump(data, 0, st.st_size, 8, (char *) "\t");
    }

    extract(data, st.st_size);

    err = munmap(data, st.st_size);
    if (err != 0) {
        printf("munmap failed with: %s\n", strerror(errno));
        return 0;
    }

    close(fd);
    return 0;
}